

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O3

void printVector<double>(vector<double,_std::allocator<double>_> *vector)

{
  double *pdVar1;
  ostream *poVar2;
  double *elem;
  double *pdVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
  pdVar1 = (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  return;
}

Assistant:

void printVector(const std::vector<T>& vector)
{
    std::cout << "[ ";
    for (const auto& elem: vector)
    {
        std::cout << elem << " ";
    }
    std::cout << "]";
}